

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR COM_setfileinfo(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  char *pcVar3;
  DLword *pDVar4;
  int *piVar5;
  bool bVar6;
  uint local_337c;
  uint local_3378;
  uint local_3370;
  uint local_336c;
  LispPTR local_335c;
  int local_3358;
  char *local_3350;
  char *lf_cp;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  timeval time [2];
  stat sbuf;
  char ver [16];
  char name [255];
  char dir [4096];
  char host [255];
  char file [4096];
  char lfname [4101];
  LispPTR local_20;
  int date;
  int rval;
  int dskp;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      local_20 = pLVar2[2];
      date = 0;
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      local_20 = pLVar2[2] << 1;
      date = 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (date == 0) {
      local_3358 = local_20 + 3;
    }
    else {
      local_3358 = local_20 + 5;
    }
    if (local_3358 < 0x1006) {
      pLVar2 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar2[2] < 0x1000) {
        local_335c = pLVar2[2];
      }
      else {
        local_335c = 0x1000;
      }
      pcVar3 = (char *)(long)(int)local_335c;
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_i = (size_t)(file + 0xff8);
        lf_dptr = (char *)((long)pDVar4 + (long)(int)(uint)(ushort)pLVar2[1]);
        for (lf_ii = 0; lf_ii < pcVar3; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (file + 0xff8)[(long)pcVar3] = '\0';
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        pDVar4 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
        lf_length = (size_t)(pDVar4 + (int)(uint)(ushort)pLVar2[1]);
        lf_sbase = (short *)(file + 0xff8);
        for (lf_cp = (char *)0x0; lf_cp < pcVar3; lf_cp = lf_cp + 1) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      separate_host(file + 0xff8,dir + 0xff8);
      for (local_3350 = dir + 0xff8; *local_3350 != '\0'; local_3350 = local_3350 + 1) {
        if (('`' < *local_3350) && (*local_3350 < '{')) {
          *local_3350 = *local_3350 + -0x20;
        }
      }
      iVar1 = strcmp(dir + 0xff8,"DSK");
      if (iVar1 == 0) {
        date = 1;
      }
      else {
        iVar1 = strcmp(dir + 0xff8,"UNIX");
        if (iVar1 != 0) {
          return 0;
        }
        date = 0;
      }
      unixpathname(file + 0xff8,host + 0xf8,date,0);
      if (date != 0) {
        iVar1 = unpack_filename(host + 0xf8,name + 0xf8,ver + 8,(char *)(sbuf.__glibc_reserved + 2),
                                1);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = true_name(name + 0xf8);
        if (iVar1 != -1) {
          return 0;
        }
        iVar1 = get_version_array(name + 0xf8,ver + 8);
        if (iVar1 == 0) {
          return 0;
        }
        if ((char)sbuf.__glibc_reserved[2] == '\0') {
          strcpy(host + 0xf8,ver + 8);
        }
        else {
          strcpy(host + 0xf8,ver + 8);
          strcat(host + 0xf8,".~");
          strcat(host + 0xf8,(char *)(sbuf.__glibc_reserved + 2));
          strcat(host + 0xf8,"~");
        }
        iVar1 = get_old(name + 0xf8,VA.files,host + 0xf8,ver + 8);
        if (iVar1 == 0) {
          return 0;
        }
      }
      if (args[1] == 0xe0002) {
        alarm(TIMEOUT_TIME);
        do {
          piVar5 = __errno_location();
          *piVar5 = 0;
          iVar1 = stat(host + 0xf8,(stat *)&time[1].tv_usec);
          bVar6 = false;
          if (iVar1 == -1) {
            piVar5 = __errno_location();
            bVar6 = *piVar5 == 4;
          }
        } while (bVar6);
        alarm(0);
        if (iVar1 == 0) {
          if ((args[2] & 0xfff0000) == 0xe0000) {
            local_336c = args[2] & 0xffff;
          }
          else {
            if ((args[2] & 0xfff0000) == 0xf0000) {
              local_3370 = args[2] | 0xffff0000;
            }
            else {
              pLVar2 = NativeAligned4FromLAddr(args[2]);
              local_3370 = *pLVar2;
            }
            local_336c = local_3370;
          }
          lf_arrayp = (OneDArray *)sbuf.st_blocks;
          time[0].tv_sec = 0;
          time[0].tv_usec = (__suseconds_t)(int)(local_336c + 0xfe36b500);
          time[1].tv_sec = 0;
          alarm(TIMEOUT_TIME);
          do {
            piVar5 = __errno_location();
            *piVar5 = 0;
            iVar1 = utimes(host + 0xf8,(timeval *)&lf_arrayp);
            bVar6 = false;
            if (iVar1 == -1) {
              piVar5 = __errno_location();
              bVar6 = *piVar5 == 4;
            }
          } while (bVar6);
          alarm(0);
          if (iVar1 == 0) {
            args_local._4_4_ = 0x4c;
          }
          else {
            piVar5 = __errno_location();
            *Lisp_errno = *piVar5;
            args_local._4_4_ = 0;
          }
        }
        else {
          piVar5 = __errno_location();
          *Lisp_errno = *piVar5;
          args_local._4_4_ = 0;
        }
      }
      else if (args[1] == 0xe0006) {
        if ((args[2] & 0xfff0000) == 0xe0000) {
          local_3378 = args[2] & 0xffff;
        }
        else {
          if ((args[2] & 0xfff0000) == 0xf0000) {
            local_337c = args[2] | 0xffff0000;
          }
          else {
            pLVar2 = NativeAligned4FromLAddr(args[2]);
            local_337c = *pLVar2;
          }
          local_3378 = local_337c;
        }
        local_20 = local_3378;
        alarm(TIMEOUT_TIME);
        do {
          piVar5 = __errno_location();
          *piVar5 = 0;
          local_20 = chmod(host + 0xf8,local_20);
          bVar6 = false;
          if (local_20 == 0xffffffff) {
            piVar5 = __errno_location();
            bVar6 = *piVar5 == 4;
          }
        } while (bVar6);
        alarm(0);
        if (local_20 == 0) {
          args_local._4_4_ = 0x4c;
        }
        else {
          piVar5 = __errno_location();
          *Lisp_errno = *piVar5;
          args_local._4_4_ = 0;
        }
      }
      else {
        args_local._4_4_ = 0;
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR COM_setfileinfo(LispPTR *args)
{
  int dskp, rval, date;
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  struct stat sbuf;
#ifndef DOS
  struct timeval time[2];
#else
  char drive[1], rawname[MAXNAMLEN];
  int extlen;
#endif /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif /* DOS */
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else  /* DOS */
  unixpathname(lfname, file, dskp, 0);
#endif /* DOS */

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  The Lisp code for SETFILEINFO always
   * recognizes a file with old mode.  Thus, we recognize it again using
   * get_old routine.  It will let us know the "real accessible" name of
   * the file.
   */
  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (get_version_array(dir, name) == 0) return (NIL);
    ConcNameAndVersion(name, ver, file);
    if (get_old(dir, VA.files, file, name) == 0) return (NIL);
  }

  switch (args[1]) {
    case WDATE:
      TIMEOUT(rval = stat(file, &sbuf));
      if (rval != 0) {
        *Lisp_errno = errno;
        return (NIL);
      }
#ifndef DOS
      date = LispNumToCInt(args[2]);
      time[0].tv_sec = (long)sbuf.st_atime;
      time[0].tv_usec = 0L;
      time[1].tv_sec = (long)ToUnixTime(date);
      time[1].tv_usec = 0L;
      TIMEOUT(rval = utimes(file, time));
#endif /* DOS */
      if (rval != 0) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);

    case PROTECTION:
      rval = LispNumToCInt(args[2]);
      TIMEOUT(rval = chmod(file, rval));
      if (rval != 0) {
        *Lisp_errno = errno;
        return (NIL);
      }
      return (ATOM_T);

    default: return (NIL);
  }
}